

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InlinePass::AddBranch
          (InlinePass *this,uint32_t label_id,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *block_ptr)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  Instruction *this_00;
  IRContext *c;
  pointer this_01;
  Operand *local_d0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_c8;
  allocator<spvtools::opt::Operand> local_bd;
  uint32_t local_bc;
  iterator local_b8;
  undefined8 local_b0;
  SmallVector<unsigned_int,_2UL> local_a8;
  Operand local_80;
  iterator local_50;
  _func_int **local_48;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_40;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_28;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> newBranch
  ;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  *block_ptr_local;
  uint32_t label_id_local;
  InlinePass *this_local;
  
  newBranch._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )block_ptr;
  this_00 = (Instruction *)::operator_new(0x70);
  c = Pass::context(&this->super_Pass);
  local_b8 = &local_bc;
  local_b0 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_b8;
  local_bc = label_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a8,init_list);
  Operand::Operand(&local_80,SPV_OPERAND_TYPE_ID,&local_a8);
  local_50 = &local_80;
  local_48 = (_func_int **)0x1;
  std::allocator<spvtools::opt::Operand>::allocator(&local_bd);
  __l._M_len = (size_type)local_48;
  __l._M_array = local_50;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_40,__l,&local_bd);
  opt::Instruction::Instruction(this_00,c,OpBranch,0,0,&local_40);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_28,this_00);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_40);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_bd);
  local_d0 = (Operand *)&local_50;
  do {
    local_d0 = local_d0 + -1;
    Operand::~Operand(local_d0);
  } while (local_d0 != &local_80);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a8);
  this_01 = std::
            unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
            operator->((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                        *)newBranch._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  unique_ptr(&local_c8,&local_28);
  BasicBlock::AddInstruction(this_01,&local_c8);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_c8);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_28);
  return;
}

Assistant:

void InlinePass::AddBranch(uint32_t label_id,
                           std::unique_ptr<BasicBlock>* block_ptr) {
  std::unique_ptr<Instruction> newBranch(
      new Instruction(context(), spv::Op::OpBranch, 0, 0,
                      {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {label_id}}}));
  (*block_ptr)->AddInstruction(std::move(newBranch));
}